

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceLoader.cpp
# Opt level: O1

void __thiscall
slang::driver::SourceLoader::addFilesInternal
          (SourceLoader *this,string_view pattern,path *basePath,bool isLibraryFile,
          SourceLibrary *library,UnitEntry *unit,bool expandEnvVars)

{
  group_type_pointer pgVar1;
  size_t *psVar2;
  value_type_pointer ppVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  bool bVar10;
  int iVar11;
  ulong uVar12;
  pair<const_std::filesystem::__cxx11::path,_unsigned_long> *ppVar13;
  uint uVar14;
  long lVar15;
  pair<const_std::filesystem::__cxx11::path,_unsigned_long> *ppVar16;
  pair<const_std::filesystem::__cxx11::path,_unsigned_long> *ppVar17;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 results;
  SourceLoader *pSVar18;
  pair<const_std::filesystem::__cxx11::path,_unsigned_long> *ppVar19;
  pair<const_std::filesystem::__cxx11::path,_unsigned_long> *args_1;
  undefined1 auVar20 [16];
  string_view pattern_00;
  error_code ec_00;
  string_view fmt;
  format_args args;
  error_code *ec_01;
  bool isLibraryFile_local;
  try_emplace_args_t local_16d;
  GlobRank rank;
  SourceLoader *local_168;
  pair<const_std::filesystem::__cxx11::path,_unsigned_long> *local_160;
  vector<slang::driver::SourceLoader::FileEntry,std::allocator<slang::driver::SourceLoader::FileEntry>>
  *local_158;
  ulong local_150;
  SourceLibrary *library_local;
  locator res;
  pointer local_118;
  size_type sStack_110;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_100;
  pair<const_std::filesystem::__cxx11::path,_unsigned_long> *local_f8;
  pointer local_f0;
  pair<const_std::filesystem::__cxx11::path,_unsigned_long> *local_e8;
  ulong local_e0;
  group_type_pointer local_d8;
  ulong local_d0;
  error_code ec;
  string_view pattern_local;
  SmallVector<std::filesystem::__cxx11::path,_2UL> files;
  
  bVar10 = expandEnvVars;
  pattern_00._M_len = pattern._M_str;
  files.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_ =
       (pointer)files.super_SmallVectorBase<std::filesystem::__cxx11::path>.firstElement;
  files.super_SmallVectorBase<std::filesystem::__cxx11::path>.len = 0;
  files.super_SmallVectorBase<std::filesystem::__cxx11::path>.cap = 2;
  ec._M_value = 0;
  ec_01 = (error_code *)0x1838f9;
  isLibraryFile_local = isLibraryFile;
  local_168 = this;
  library_local = library;
  pattern_local._M_len = pattern._M_len;
  pattern_local._M_str = pattern_00._M_len;
  ec._M_cat = (error_category *)std::_V2::system_category();
  results._1_7_ = 0;
  results._0_1_ = bVar10;
  pattern_00._M_str = (char *)0x0;
  rank = svGlob((slang *)basePath,(path *)pattern._M_len,pattern_00,(GlobMode)&files,
                (SmallVector<std::filesystem::__cxx11::path,_2UL> *)results.values_,SUB81(&ec,0),
                ec_01);
  if (ec._M_value == 0) {
    local_158 = (vector<slang::driver::SourceLoader::FileEntry,std::allocator<slang::driver::SourceLoader::FileEntry>>
                 *)&local_168->fileEntries;
    ppVar16 = (pair<const_std::filesystem::__cxx11::path,_unsigned_long> *)
              (((long)(local_168->fileEntries).
                      super__Vector_base<slang::driver::SourceLoader::FileEntry,_std::allocator<slang::driver::SourceLoader::FileEntry>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(local_168->fileEntries).
                      super__Vector_base<slang::driver::SourceLoader::FileEntry,_std::allocator<slang::driver::SourceLoader::FileEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5 +
              files.super_SmallVectorBase<std::filesystem::__cxx11::path>.len);
    std::
    vector<slang::driver::SourceLoader::FileEntry,_std::allocator<slang::driver::SourceLoader::FileEntry>_>
    ::reserve((vector<slang::driver::SourceLoader::FileEntry,_std::allocator<slang::driver::SourceLoader::FileEntry>_>
               *)local_158,(size_type)ppVar16);
    if (files.super_SmallVectorBase<std::filesystem::__cxx11::path>.len != 0) {
      local_f0 = files.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_ +
                 files.super_SmallVectorBase<std::filesystem::__cxx11::path>.len;
      local_160 = (pair<const_std::filesystem::__cxx11::path,_unsigned_long> *)&local_168->fileIndex
      ;
      local_100 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                  &local_168->errors;
      pSVar18 = local_168;
      args_1 = (pair<const_std::filesystem::__cxx11::path,_unsigned_long> *)
               files.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_;
      do {
        local_118 = (pointer)(((long)(pSVar18->fileEntries).
                                     super__Vector_base<slang::driver::SourceLoader::FileEntry,_std::allocator<slang::driver::SourceLoader::FileEntry>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pSVar18->fileEntries).
                                     super__Vector_base<slang::driver::SourceLoader::FileEntry,_std::allocator<slang::driver::SourceLoader::FileEntry>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x4ec4ec4ec4ec4ec5);
        uVar12 = std::filesystem::__cxx11::hash_value(&args_1->first);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar12;
        local_150 = SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                    SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),0);
        ppVar16 = (pair<const_std::filesystem::__cxx11::path,_unsigned_long> *)
                  (local_150 >>
                  ((byte)(pSVar18->fileIndex).table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,_unsigned_long>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_unsigned_long>_>_>
                         .arrays.groups_size_index & 0x3f));
        lVar15 = (local_150 & 0xff) * 4;
        uVar6 = (&UNK_0046cabc)[lVar15];
        uVar7 = (&UNK_0046cabd)[lVar15];
        uVar8 = (&UNK_0046cabe)[lVar15];
        uVar9 = (&UNK_0046cabf)[lVar15];
        local_e0 = (ulong)((uint)local_150 & 7);
        uVar12 = 0;
        local_e8 = ppVar16;
        do {
          local_d8 = (pSVar18->fileIndex).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,_unsigned_long>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_unsigned_long>_>_>
                     .arrays.groups_;
          pgVar1 = local_d8 + (long)ppVar16;
          auVar20[0] = -(pgVar1->m[0].n == uVar6);
          auVar20[1] = -(pgVar1->m[1].n == uVar7);
          auVar20[2] = -(pgVar1->m[2].n == uVar8);
          auVar20[3] = -(pgVar1->m[3].n == uVar9);
          auVar20[4] = -(pgVar1->m[4].n == uVar6);
          auVar20[5] = -(pgVar1->m[5].n == uVar7);
          auVar20[6] = -(pgVar1->m[6].n == uVar8);
          auVar20[7] = -(pgVar1->m[7].n == uVar9);
          auVar20[8] = -(pgVar1->m[8].n == uVar6);
          auVar20[9] = -(pgVar1->m[9].n == uVar7);
          auVar20[10] = -(pgVar1->m[10].n == uVar8);
          auVar20[0xb] = -(pgVar1->m[0xb].n == uVar9);
          auVar20[0xc] = -(pgVar1->m[0xc].n == uVar6);
          auVar20[0xd] = -(pgVar1->m[0xd].n == uVar7);
          auVar20[0xe] = -(pgVar1->m[0xe].n == uVar8);
          auVar20[0xf] = -(pgVar1->m[0xf].n == uVar9);
          uVar14 = (uint)(ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe);
          ppVar17 = ppVar16;
          local_f8 = ppVar16;
          local_d0 = uVar12;
          if (uVar14 != 0) {
            ppVar3 = (pSVar18->fileIndex).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,_unsigned_long>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_unsigned_long>_>_>
                     .arrays.elements_;
            do {
              iVar11 = 0;
              if (uVar14 != 0) {
                for (; (uVar14 >> iVar11 & 1) == 0; iVar11 = iVar11 + 1) {
                }
              }
              ppVar19 = (pair<const_std::filesystem::__cxx11::path,_unsigned_long> *)
                        ((long)&ppVar3[(long)ppVar16 * 0xf].first._M_pathname._M_dataplus._M_p +
                        (ulong)(uint)(iVar11 * 0x30));
              ppVar17 = ppVar19;
              iVar11 = std::filesystem::__cxx11::path::compare(&args_1->first);
              if (iVar11 == 0) goto LAB_00183b69;
              uVar14 = uVar14 - 1 & uVar14;
            } while (uVar14 != 0);
          }
          if ((local_d8[(long)ppVar16].m[0xf].n &
              (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::
                is_not_overflowed(unsigned_long)::shift)[local_e0]) == 0) {
            ppVar19 = (pair<const_std::filesystem::__cxx11::path,_unsigned_long> *)0x0;
            goto LAB_00183b69;
          }
          uVar4 = (local_168->fileIndex).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,_unsigned_long>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_unsigned_long>_>_>
                  .arrays.groups_size_mask;
          uVar12 = local_d0 + 1;
          ppVar16 = (pair<const_std::filesystem::__cxx11::path,_unsigned_long> *)
                    ((long)&(local_f8->first)._M_pathname._M_dataplus._M_p + local_d0 + 1 & uVar4);
          pSVar18 = local_168;
        } while (uVar12 <= uVar4);
        ppVar19 = (pair<const_std::filesystem::__cxx11::path,_unsigned_long> *)0x0;
        ppVar17 = ppVar16;
LAB_00183b69:
        pSVar18 = local_168;
        ppVar16 = (pair<const_std::filesystem::__cxx11::path,_unsigned_long> *)&res;
        ppVar13 = ppVar19;
        if (ppVar19 == (pair<const_std::filesystem::__cxx11::path,_unsigned_long> *)0x0) {
          ppVar17 = local_160;
          if ((local_168->fileIndex).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,_unsigned_long>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_unsigned_long>_>_>
              .size_ctrl.size <
              (local_168->fileIndex).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,_unsigned_long>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_unsigned_long>_>_>
              .size_ctrl.ml) {
            results.values_ = (value<fmt::v11::context> *)&local_16d;
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::filesystem::__cxx11::path,void>,std::equal_to<std::filesystem::__cxx11::path>,std::allocator<std::pair<std::filesystem::__cxx11::path_const,unsigned_long>>>
            ::
            nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::filesystem::__cxx11::path_const&,unsigned_long>
                      ((locator *)ppVar16,
                       (table_core<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::filesystem::__cxx11::path,void>,std::equal_to<std::filesystem::__cxx11::path>,std::allocator<std::pair<std::filesystem::__cxx11::path_const,unsigned_long>>>
                        *)local_160,(arrays_type *)local_160,(size_t)local_e8,local_150,
                       (try_emplace_args_t *)results.values_,&args_1->first,
                       (unsigned_long *)&local_118);
            psVar2 = &(pSVar18->fileIndex).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,_unsigned_long>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_unsigned_long>_>_>
                      .size_ctrl.size;
            *psVar2 = *psVar2 + 1;
            ppVar13 = res.p;
          }
          else {
            results.values_ = (value<fmt::v11::context> *)&local_118;
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::filesystem::__cxx11::path,void>,std::equal_to<std::filesystem::__cxx11::path>,std::allocator<std::pair<std::filesystem::__cxx11::path_const,unsigned_long>>>
            ::
            unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::filesystem::__cxx11::path_const&,unsigned_long>
                      ((locator *)ppVar16,
                       (table_core<boost::unordered::detail::foa::flat_map_types<std::filesystem::__cxx11::path,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::filesystem::__cxx11::path,void>,std::equal_to<std::filesystem::__cxx11::path>,std::allocator<std::pair<std::filesystem::__cxx11::path_const,unsigned_long>>>
                        *)local_160,local_150,&local_16d,&args_1->first,
                       (unsigned_long *)results.values_);
            ppVar13 = res.p;
          }
        }
        if (ppVar19 == (pair<const_std::filesystem::__cxx11::path,_unsigned_long> *)0x0) {
          results.values_ = (value<fmt::v11::context> *)&rank;
          ppVar16 = args_1;
          std::
          vector<slang::driver::SourceLoader::FileEntry,std::allocator<slang::driver::SourceLoader::FileEntry>>
          ::
          emplace_back<std::filesystem::__cxx11::path,bool&,slang::SourceLibrary_const*&,slang::driver::SourceLoader::UnitEntry_const*&,slang::GlobRank&>
                    (local_158,&args_1->first,&isLibraryFile_local,&library_local,&unit,
                     (GlobRank *)results.values_);
        }
        else {
          lVar15 = ppVar13->second * 0x68;
          if (*(long *)(*(long *)local_158 + 0x58 + lVar15) == 0 && unit == (UnitEntry *)0x0) {
            lVar15 = *(long *)local_158 + lVar15;
            *(byte *)(lVar15 + 100) = *(byte *)(lVar15 + 100) & isLibraryFile_local;
            ppVar16 = ppVar17;
            if (library_local != (SourceLibrary *)0x0) {
              if ((*(long *)(lVar15 + 0x48) == 0) || ((int)rank < (int)*(GlobRank *)(lVar15 + 0x60))
                 ) {
                *(SourceLibrary **)(lVar15 + 0x48) = library_local;
                *(GlobRank *)(lVar15 + 0x60) = rank;
                *(undefined8 *)(lVar15 + 0x50) = 0;
              }
              else if (rank == *(GlobRank *)(lVar15 + 0x60)) {
                *(SourceLibrary **)(lVar15 + 0x50) = library_local;
              }
            }
          }
          else {
            local_118 = (args_1->first)._M_pathname._M_dataplus._M_p;
            sStack_110 = (args_1->first)._M_pathname._M_string_length;
            fmt.size_ = 0xd;
            fmt.data_ = (char *)0x2c;
            args.field_1.args_ = results.args_;
            args.desc_ = (unsigned_long_long)&local_118;
            ::fmt::v11::vformat_abi_cxx11_
                      ((string *)ppVar16,(v11 *)"\'{}\': included in multiple compilation units",fmt
                       ,args);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      (local_100,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ppVar16)
            ;
            if (res.pg != (group15<boost::unordered::detail::foa::plain_integral> *)&res.p) {
              ppVar16 = (pair<const_std::filesystem::__cxx11::path,_unsigned_long> *)
                        ((long)&((res.p)->first)._M_pathname._M_dataplus._M_p + 1);
              operator_delete(res.pg,(size_t)ppVar16);
            }
          }
        }
        args_1 = (pair<const_std::filesystem::__cxx11::path,_unsigned_long> *)&args_1->second;
      } while (args_1 != (pair<const_std::filesystem::__cxx11::path,_unsigned_long> *)local_f0);
    }
  }
  else {
    std::filesystem::__cxx11::path::
    path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
              ((path *)&res,&pattern_local,auto_format);
    ec_00._4_4_ = 0;
    ec_00._M_value = ec._M_value;
    ppVar16 = (pair<const_std::filesystem::__cxx11::path,_unsigned_long> *)&res;
    ec_00._M_cat = ec._M_cat;
    addError(local_168,(path *)ppVar16,ec_00);
    std::filesystem::__cxx11::path::~path((path *)&res);
  }
  SmallVectorBase<std::filesystem::__cxx11::path>::cleanup
            (&files.super_SmallVectorBase<std::filesystem::__cxx11::path>,(EVP_PKEY_CTX *)ppVar16);
  return;
}

Assistant:

void SourceLoader::addFilesInternal(std::string_view pattern, const fs::path& basePath,
                                    bool isLibraryFile, const SourceLibrary* library,
                                    const UnitEntry* unit, bool expandEnvVars) {
    SmallVector<fs::path> files;
    std::error_code ec;
    auto rank = svGlob(basePath, pattern, GlobMode::Files, files, expandEnvVars, ec);
    if (ec) {
        addError(pattern, ec);
        return;
    }

    fileEntries.reserve(fileEntries.size() + files.size());
    for (auto&& path : files) {
        auto [it, inserted] = fileIndex.try_emplace(path, fileEntries.size());
        if (inserted) {
            fileEntries.emplace_back(std::move(path), isLibraryFile, library, unit, rank);
        }
        else {
            // If this file is supposed to be in a separate unit but is already
            // included elsewhere we should error.
            auto& entry = fileEntries[it->second];
            if (unit || entry.unit) {
                errors.emplace_back(
                    fmt::format("'{}': included in multiple compilation units", getU8Str(path)));
                continue;
            }

            // If any of the times we see this is entry is for a non-library file,
            // then it's always a non-library file, hence the &=.
            entry.isLibraryFile &= isLibraryFile;

            if (library) {
                // If there is already a library for this entry and our rank is lower,
                // we overrule it. If it's higher, we ignore. If it's a tie, we remember
                // that fact for now and later we will issue an error if the tie is
                // never resolved.
                if (!entry.library || rank < entry.libraryRank) {
                    entry.library = library;
                    entry.libraryRank = rank;
                    entry.secondLib = nullptr;
                }
                else if (rank == entry.libraryRank) {
                    entry.secondLib = library;
                }
            }
        }
    }
}